

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.c
# Opt level: O2

OPJ_BOOL opj_sparse_array_int32_read_or_write
                   (opj_sparse_array_int32_t *sa,OPJ_UINT32 x0,OPJ_UINT32 y0,OPJ_UINT32 x1,
                   OPJ_UINT32 y1,OPJ_INT32 *buf,OPJ_UINT32 buf_col_stride,OPJ_UINT32 buf_line_stride
                   ,OPJ_BOOL forgiving,OPJ_BOOL is_read_op)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  OPJ_BOOL OVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  OPJ_INT32 *pOVar8;
  OPJ_INT32 *pOVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  OPJ_UINT32 OVar14;
  OPJ_INT32 *pOVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  bool bVar22;
  uint local_94;
  
  uVar1 = sa->block_width;
  uVar20 = (ulong)uVar1;
  OVar4 = opj_sparse_array_is_region_valid(sa,x0,y0,x1,y1);
  if (OVar4 != 0) {
    local_94 = y0 / sa->block_height;
    uVar7 = (ulong)buf_line_stride;
    for (OVar14 = y0; uVar16 = y1 - OVar14, OVar14 <= y1 && uVar16 != 0; OVar14 = OVar14 + uVar16) {
      uVar6 = sa->block_height;
      uVar5 = uVar6;
      if (OVar14 - y0 == 0) {
        uVar5 = uVar6 - y0 % uVar6;
      }
      if (uVar5 < uVar16) {
        uVar16 = uVar5;
      }
      uVar11 = (ulong)x0;
      uVar19 = uVar11 / uVar20;
      lVar17 = (uVar6 - uVar5) * uVar20;
      lVar10 = (OVar14 - y0) * uVar7;
      while( true ) {
        uVar5 = (uint)uVar11;
        uVar6 = x1 - uVar5;
        if (x1 < uVar5 || uVar6 == 0) break;
        uVar21 = uVar5 - x0;
        uVar12 = uVar1 - x0 % uVar1;
        if (uVar21 != 0) {
          uVar12 = uVar1;
        }
        uVar2 = uVar12;
        if (uVar6 <= uVar12) {
          uVar2 = uVar6;
        }
        iVar18 = (int)uVar19;
        pOVar8 = sa->data_blocks[sa->block_count_hor * local_94 + iVar18];
        uVar19 = (ulong)uVar2;
        if (is_read_op == 0) {
          if (pOVar8 == (OPJ_INT32 *)0x0) {
            pOVar8 = (OPJ_INT32 *)opj_calloc(1,(ulong)(sa->block_height * sa->block_width) << 2);
            if (pOVar8 == (OPJ_INT32 *)0x0) {
              return 0;
            }
            sa->data_blocks[sa->block_count_hor * local_94 + iVar18] = pOVar8;
          }
          pOVar8 = pOVar8 + lVar17 + (ulong)(uVar1 - uVar12);
          if (buf_col_stride == 1) {
            pOVar9 = buf + lVar10 + (ulong)uVar21;
            uVar6 = uVar16;
            if (uVar2 == 4) {
              while (uVar6 != 0) {
                uVar3 = *(undefined8 *)(pOVar9 + 2);
                *(undefined8 *)pOVar8 = *(undefined8 *)pOVar9;
                *(undefined8 *)(pOVar8 + 2) = uVar3;
                pOVar8 = pOVar8 + uVar20;
                pOVar9 = pOVar9 + uVar7;
                uVar6 = uVar6 - 1;
              }
            }
            else {
              while (bVar22 = uVar6 != 0, uVar6 = uVar6 - 1, bVar22) {
                memcpy(pOVar8,pOVar9,uVar19 << 2);
                pOVar8 = pOVar8 + uVar20;
                pOVar9 = pOVar9 + uVar7;
              }
            }
          }
          else {
            pOVar9 = buf + lVar10 + (ulong)(uVar21 * buf_col_stride);
            uVar6 = uVar16;
            if (uVar2 == 1) {
              while (uVar6 != 0) {
                *pOVar8 = *pOVar9;
                pOVar8 = pOVar8 + uVar20;
                pOVar9 = pOVar9 + uVar7;
                uVar6 = uVar6 - 1;
              }
            }
            else if ((buf_col_stride == 8) && (7 < uVar2)) {
              for (uVar6 = 0; uVar6 != uVar16; uVar6 = uVar6 + 1) {
                uVar12 = 0;
                pOVar15 = pOVar8;
                for (uVar11 = 0; uVar11 < (uVar2 & 0xfffffffc); uVar11 = uVar11 + 4) {
                  pOVar8[uVar11] = pOVar9[uVar12];
                  pOVar8[uVar11 + 1] = pOVar9[uVar12 + 8 & 0xffffffe8];
                  pOVar8[uVar11 + 2] = pOVar9[uVar12 + 0x10];
                  pOVar8[uVar11 + 3] = pOVar9[uVar12 + 0x18];
                  uVar12 = uVar12 + 0x20;
                  pOVar15 = pOVar15 + 4;
                }
                for (; uVar11 < uVar19; uVar11 = uVar11 + 1) {
                  *pOVar15 = pOVar9[uVar12];
                  uVar12 = uVar12 + 8;
                  pOVar15 = pOVar15 + 1;
                }
                pOVar9 = pOVar9 + uVar7;
                pOVar8 = pOVar8 + uVar20;
              }
            }
            else {
              for (uVar6 = 0; uVar6 != uVar16; uVar6 = uVar6 + 1) {
                uVar12 = 0;
                for (uVar11 = 0; uVar19 != uVar11; uVar11 = uVar11 + 1) {
                  pOVar8[uVar11] = pOVar9[uVar12];
                  uVar12 = uVar12 + buf_col_stride;
                }
                pOVar9 = pOVar9 + uVar7;
                pOVar8 = pOVar8 + uVar20;
              }
            }
          }
        }
        else if (pOVar8 == (OPJ_INT32 *)0x0) {
          if (buf_col_stride == 1) {
            pOVar8 = buf + lVar10 + (ulong)uVar21;
            uVar6 = uVar16;
            while (bVar22 = uVar6 != 0, uVar6 = uVar6 - 1, bVar22) {
              memset(pOVar8,0,uVar19 << 2);
              pOVar8 = pOVar8 + uVar7;
            }
          }
          else {
            pOVar8 = buf + lVar10 + (ulong)(uVar21 * buf_col_stride);
            for (uVar6 = 0; uVar6 != uVar16; uVar6 = uVar6 + 1) {
              uVar12 = 0;
              uVar11 = uVar19;
              while (bVar22 = uVar11 != 0, uVar11 = uVar11 - 1, bVar22) {
                pOVar8[uVar12] = 0;
                uVar12 = uVar12 + buf_col_stride;
              }
              pOVar8 = pOVar8 + uVar7;
            }
          }
        }
        else {
          pOVar8 = pOVar8 + lVar17 + (ulong)(uVar1 - uVar12);
          if (buf_col_stride == 1) {
            pOVar9 = buf + lVar10 + (ulong)uVar21;
            uVar6 = uVar16;
            if (uVar2 == 4) {
              while (uVar6 != 0) {
                uVar3 = *(undefined8 *)(pOVar8 + 2);
                *(undefined8 *)pOVar9 = *(undefined8 *)pOVar8;
                *(undefined8 *)(pOVar9 + 2) = uVar3;
                pOVar8 = pOVar8 + uVar20;
                pOVar9 = pOVar9 + uVar7;
                uVar6 = uVar6 - 1;
              }
            }
            else {
              while (bVar22 = uVar6 != 0, uVar6 = uVar6 - 1, bVar22) {
                memcpy(pOVar9,pOVar8,uVar19 << 2);
                pOVar8 = pOVar8 + uVar20;
                pOVar9 = pOVar9 + uVar7;
              }
            }
          }
          else {
            pOVar9 = buf + lVar10 + (ulong)(uVar21 * buf_col_stride);
            uVar6 = uVar16;
            if (uVar2 == 1) {
              while (uVar6 != 0) {
                *pOVar9 = *pOVar8;
                pOVar8 = pOVar8 + uVar20;
                pOVar9 = pOVar9 + uVar7;
                uVar6 = uVar6 - 1;
              }
            }
            else if (uVar16 == 1 && buf_col_stride == 2) {
              uVar11 = 0;
              for (uVar13 = 0; uVar13 < (uVar2 & 0xfffffffc); uVar13 = uVar13 + 4) {
                uVar6 = (uint)uVar13;
                pOVar9[uVar6 * 2] = pOVar8[uVar13];
                pOVar9[(uVar6 | 1) * 2 & 0xfffffffa] = pOVar8[uVar13 + 1];
                pOVar9[(uVar6 | 2) * 2] = pOVar8[uVar13 + 2];
                pOVar9[(uVar6 | 3) * 2] = pOVar8[uVar13 + 3];
                uVar11 = uVar11 + 8;
              }
              for (; uVar13 < uVar19; uVar13 = uVar13 + 1) {
                pOVar9[uVar11 & 0xffffffff] = *(OPJ_INT32 *)((long)pOVar8 + uVar11 * 2);
                uVar11 = uVar11 + 2;
              }
            }
            else if ((buf_col_stride == 8) && (7 < uVar2)) {
              for (uVar6 = 0; uVar6 != uVar16; uVar6 = uVar6 + 1) {
                uVar12 = 0;
                pOVar15 = pOVar8;
                for (uVar11 = 0; uVar11 < (uVar2 & 0xfffffffc); uVar11 = uVar11 + 4) {
                  pOVar9[uVar12] = pOVar8[uVar11];
                  pOVar9[uVar12 + 8 & 0xffffffe8] = pOVar8[uVar11 + 1];
                  pOVar9[uVar12 + 0x10] = pOVar8[uVar11 + 2];
                  pOVar9[uVar12 + 0x18] = pOVar8[uVar11 + 3];
                  uVar12 = uVar12 + 0x20;
                  pOVar15 = pOVar15 + 4;
                }
                for (; uVar11 < uVar19; uVar11 = uVar11 + 1) {
                  pOVar9[uVar12] = *pOVar15;
                  uVar12 = uVar12 + 8;
                  pOVar15 = pOVar15 + 1;
                }
                pOVar9 = pOVar9 + uVar7;
                pOVar8 = pOVar8 + uVar20;
              }
            }
            else {
              for (uVar6 = 0; uVar6 != uVar16; uVar6 = uVar6 + 1) {
                uVar12 = 0;
                for (uVar11 = 0; uVar19 != uVar11; uVar11 = uVar11 + 1) {
                  pOVar9[uVar12] = pOVar8[uVar11];
                  uVar12 = uVar12 + buf_col_stride;
                }
                pOVar9 = pOVar9 + uVar7;
                pOVar8 = pOVar8 + uVar20;
              }
            }
          }
        }
        uVar19 = (ulong)(iVar18 + 1);
        uVar11 = (ulong)(uVar5 + uVar2);
      }
      local_94 = local_94 + 1;
    }
    forgiving = 1;
  }
  return forgiving;
}

Assistant:

static OPJ_BOOL opj_sparse_array_int32_read_or_write(
    const opj_sparse_array_int32_t* sa,
    OPJ_UINT32 x0,
    OPJ_UINT32 y0,
    OPJ_UINT32 x1,
    OPJ_UINT32 y1,
    OPJ_INT32* buf,
    OPJ_UINT32 buf_col_stride,
    OPJ_UINT32 buf_line_stride,
    OPJ_BOOL forgiving,
    OPJ_BOOL is_read_op)
{
    OPJ_UINT32 y, block_y;
    OPJ_UINT32 y_incr = 0;
    const OPJ_UINT32 block_width = sa->block_width;

    if (!opj_sparse_array_is_region_valid(sa, x0, y0, x1, y1)) {
        return forgiving;
    }

    block_y = y0 / sa->block_height;
    for (y = y0; y < y1; block_y ++, y += y_incr) {
        OPJ_UINT32 x, block_x;
        OPJ_UINT32 x_incr = 0;
        OPJ_UINT32 block_y_offset;
        y_incr = (y == y0) ? sa->block_height - (y0 % sa->block_height) :
                 sa->block_height;
        block_y_offset = sa->block_height - y_incr;
        y_incr = opj_uint_min(y_incr, y1 - y);
        block_x = x0 / block_width;
        for (x = x0; x < x1; block_x ++, x += x_incr) {
            OPJ_UINT32 j;
            OPJ_UINT32 block_x_offset;
            OPJ_INT32* src_block;
            x_incr = (x == x0) ? block_width - (x0 % block_width) : block_width;
            block_x_offset = block_width - x_incr;
            x_incr = opj_uint_min(x_incr, x1 - x);
            src_block = sa->data_blocks[block_y * sa->block_count_hor + block_x];
            if (is_read_op) {
                if (src_block == NULL) {
                    if (buf_col_stride == 1) {
                        OPJ_INT32* dest_ptr = buf + (y - y0) * (OPJ_SIZE_T)buf_line_stride +
                                              (x - x0) * buf_col_stride;
                        for (j = 0; j < y_incr; j++) {
                            memset(dest_ptr, 0, sizeof(OPJ_INT32) * x_incr);
                            dest_ptr += buf_line_stride;
                        }
                    } else {
                        OPJ_INT32* dest_ptr = buf + (y - y0) * (OPJ_SIZE_T)buf_line_stride +
                                              (x - x0) * buf_col_stride;
                        for (j = 0; j < y_incr; j++) {
                            OPJ_UINT32 k;
                            for (k = 0; k < x_incr; k++) {
                                dest_ptr[k * buf_col_stride] = 0;
                            }
                            dest_ptr += buf_line_stride;
                        }
                    }
                } else {
                    const OPJ_INT32* OPJ_RESTRICT src_ptr = src_block + block_y_offset *
                                                            (OPJ_SIZE_T)block_width + block_x_offset;
                    if (buf_col_stride == 1) {
                        OPJ_INT32* OPJ_RESTRICT dest_ptr = buf + (y - y0) * (OPJ_SIZE_T)buf_line_stride
                                                           +
                                                           (x - x0) * buf_col_stride;
                        if (x_incr == 4) {
                            /* Same code as general branch, but the compiler */
                            /* can have an efficient memcpy() */
                            (void)(x_incr); /* trick to silent cppcheck duplicateBranch warning */
                            for (j = 0; j < y_incr; j++) {
                                memcpy(dest_ptr, src_ptr, sizeof(OPJ_INT32) * x_incr);
                                dest_ptr += buf_line_stride;
                                src_ptr += block_width;
                            }
                        } else {
                            for (j = 0; j < y_incr; j++) {
                                memcpy(dest_ptr, src_ptr, sizeof(OPJ_INT32) * x_incr);
                                dest_ptr += buf_line_stride;
                                src_ptr += block_width;
                            }
                        }
                    } else {
                        OPJ_INT32* OPJ_RESTRICT dest_ptr = buf + (y - y0) * (OPJ_SIZE_T)buf_line_stride
                                                           +
                                                           (x - x0) * buf_col_stride;
                        if (x_incr == 1) {
                            for (j = 0; j < y_incr; j++) {
                                *dest_ptr = *src_ptr;
                                dest_ptr += buf_line_stride;
                                src_ptr += block_width;
                            }
                        } else if (y_incr == 1 && buf_col_stride == 2) {
                            OPJ_UINT32 k;
                            for (k = 0; k < (x_incr & ~3U); k += 4) {
                                dest_ptr[k * buf_col_stride] = src_ptr[k];
                                dest_ptr[(k + 1) * buf_col_stride] = src_ptr[k + 1];
                                dest_ptr[(k + 2) * buf_col_stride] = src_ptr[k + 2];
                                dest_ptr[(k + 3) * buf_col_stride] = src_ptr[k + 3];
                            }
                            for (; k < x_incr; k++) {
                                dest_ptr[k * buf_col_stride] = src_ptr[k];
                            }
                        } else if (x_incr >= 8 && buf_col_stride == 8) {
                            for (j = 0; j < y_incr; j++) {
                                OPJ_UINT32 k;
                                for (k = 0; k < (x_incr & ~3U); k += 4) {
                                    dest_ptr[k * buf_col_stride] = src_ptr[k];
                                    dest_ptr[(k + 1) * buf_col_stride] = src_ptr[k + 1];
                                    dest_ptr[(k + 2) * buf_col_stride] = src_ptr[k + 2];
                                    dest_ptr[(k + 3) * buf_col_stride] = src_ptr[k + 3];
                                }
                                for (; k < x_incr; k++) {
                                    dest_ptr[k * buf_col_stride] = src_ptr[k];
                                }
                                dest_ptr += buf_line_stride;
                                src_ptr += block_width;
                            }
                        } else {
                            /* General case */
                            for (j = 0; j < y_incr; j++) {
                                OPJ_UINT32 k;
                                for (k = 0; k < x_incr; k++) {
                                    dest_ptr[k * buf_col_stride] = src_ptr[k];
                                }
                                dest_ptr += buf_line_stride;
                                src_ptr += block_width;
                            }
                        }
                    }
                }
            } else {
                if (src_block == NULL) {
                    src_block = (OPJ_INT32*) opj_calloc(1,
                                                        sa->block_width * sa->block_height * sizeof(OPJ_INT32));
                    if (src_block == NULL) {
                        return OPJ_FALSE;
                    }
                    sa->data_blocks[block_y * sa->block_count_hor + block_x] = src_block;
                }

                if (buf_col_stride == 1) {
                    OPJ_INT32* OPJ_RESTRICT dest_ptr = src_block + block_y_offset *
                                                       (OPJ_SIZE_T)block_width + block_x_offset;
                    const OPJ_INT32* OPJ_RESTRICT src_ptr = buf + (y - y0) *
                                                            (OPJ_SIZE_T)buf_line_stride + (x - x0) * buf_col_stride;
                    if (x_incr == 4) {
                        /* Same code as general branch, but the compiler */
                        /* can have an efficient memcpy() */
                        (void)(x_incr); /* trick to silent cppcheck duplicateBranch warning */
                        for (j = 0; j < y_incr; j++) {
                            memcpy(dest_ptr, src_ptr, sizeof(OPJ_INT32) * x_incr);
                            dest_ptr += block_width;
                            src_ptr += buf_line_stride;
                        }
                    } else {
                        for (j = 0; j < y_incr; j++) {
                            memcpy(dest_ptr, src_ptr, sizeof(OPJ_INT32) * x_incr);
                            dest_ptr += block_width;
                            src_ptr += buf_line_stride;
                        }
                    }
                } else {
                    OPJ_INT32* OPJ_RESTRICT dest_ptr = src_block + block_y_offset *
                                                       (OPJ_SIZE_T)block_width + block_x_offset;
                    const OPJ_INT32* OPJ_RESTRICT src_ptr = buf + (y - y0) *
                                                            (OPJ_SIZE_T)buf_line_stride + (x - x0) * buf_col_stride;
                    if (x_incr == 1) {
                        for (j = 0; j < y_incr; j++) {
                            *dest_ptr = *src_ptr;
                            src_ptr += buf_line_stride;
                            dest_ptr += block_width;
                        }
                    } else if (x_incr >= 8 && buf_col_stride == 8) {
                        for (j = 0; j < y_incr; j++) {
                            OPJ_UINT32 k;
                            for (k = 0; k < (x_incr & ~3U); k += 4) {
                                dest_ptr[k] = src_ptr[k * buf_col_stride];
                                dest_ptr[k + 1] = src_ptr[(k + 1) * buf_col_stride];
                                dest_ptr[k + 2] = src_ptr[(k + 2) * buf_col_stride];
                                dest_ptr[k + 3] = src_ptr[(k + 3) * buf_col_stride];
                            }
                            for (; k < x_incr; k++) {
                                dest_ptr[k] = src_ptr[k * buf_col_stride];
                            }
                            src_ptr += buf_line_stride;
                            dest_ptr += block_width;
                        }
                    } else {
                        /* General case */
                        for (j = 0; j < y_incr; j++) {
                            OPJ_UINT32 k;
                            for (k = 0; k < x_incr; k++) {
                                dest_ptr[k] = src_ptr[k * buf_col_stride];
                            }
                            src_ptr += buf_line_stride;
                            dest_ptr += block_width;
                        }
                    }
                }
            }
        }
    }

    return OPJ_TRUE;
}